

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O1

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::values
          (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           *__return_storage_ptr__,DefinitionsMap<dg::dda::RWNode> *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var3 = (this->_definitions)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    for (p_Var2 = (_Rb_tree_node_base *)p_Var3[5]._M_nxt;
        p_Var2 != (_Rb_tree_node_base *)(p_Var3 + 3);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::
      _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
                ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                  *)__return_storage_ptr__,p_Var2[2]._M_parent,
                 (_Rb_tree_const_iterator<dg::dda::RWNode_*>)&p_Var2[1]._M_right);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<NodeT *> values() const {
        std::set<NodeT *> ret;
        for (auto &it : _definitions) {
            for (auto &it2 : it.second) {
                ret.insert(it2.second.begin(), it2.second.end());
            }
        }
        return ret;
    }